

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fShaderIndexingTests.cpp
# Opt level: O2

void deqp::gles2::Functional::evalSubscriptVec3(ShaderEvalContext *c)

{
  Vector<float,_3> local_34;
  VecAccess<float,_4,_3> local_28;
  
  tcu::Vector<float,_3>::Vector
            (&local_34,
             (c->coords).m_data[2] * 0.25 + (c->coords).m_data[1] * 0.5 + (c->coords).m_data[0]);
  local_28.m_vector = &c->color;
  local_28.m_index[0] = 0;
  local_28.m_index[1] = 1;
  local_28.m_index[2] = 2;
  tcu::VecAccess<float,_4,_3>::operator=(&local_28,&local_34);
  return;
}

Assistant:

void evalSubscriptVec3 (ShaderEvalContext& c) { c.color.xyz() = Vec3(c.coords.x() + 0.5f*c.coords.y() + 0.25f*c.coords.z()); }